

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TableGrow * __thiscall
wasm::Builder::makeTableGrow(Builder *this,Name table,Expression *value,Expression *delta)

{
  bool bVar1;
  TableGrow *this_00;
  
  this_00 = MixedArena::alloc<wasm::TableGrow>(&this->wasm->allocator);
  (this_00->table).super_IString.str._M_len = table.super_IString.str._M_len;
  (this_00->table).super_IString.str._M_str = table.super_IString.str._M_str;
  this_00->value = value;
  this_00->delta = delta;
  bVar1 = isTable64(this,table);
  if (bVar1) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression.type.id = 3;
  }
  TableGrow::finalize(this_00);
  return this_00;
}

Assistant:

TableGrow* makeTableGrow(Name table, Expression* value, Expression* delta) {
    auto* ret = wasm.allocator.alloc<TableGrow>();
    ret->table = table;
    ret->value = value;
    ret->delta = delta;
    if (isTable64(table)) {
      ret->type = Type::i64;
    }
    ret->finalize();
    return ret;
  }